

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Cylinder::Sample(Cylinder *this,Point2f u)

{
  Point2f uv_00;
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Vector3,_float> t_00;
  Vector3f e;
  Normal3f n_00;
  undefined1 auVar1 [16];
  Point3f p;
  Normal3<float> n_01;
  float *pfVar2;
  Cylinder *in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar11;
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  Vector3<float> VVar13;
  Normal3<float> NVar14;
  Point2f uv;
  Normal3f n;
  Point3fi pi;
  Vector3f pObjError;
  Float hitRad;
  Point3f pObj;
  Float phi;
  Float z;
  optional<pbrt::ShapeSample> *this_00;
  Interaction *this_01;
  float in_stack_fffffffffffffd90;
  Float s;
  float in_stack_fffffffffffffda8;
  float fVar15;
  undefined4 uStack_24c;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 uVar16;
  float in_stack_fffffffffffffdd0;
  float fVar17;
  Transform *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  float local_154;
  undefined8 local_13c;
  float local_134;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_7c;
  undefined4 local_74;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  float local_30;
  float local_2c;
  float fStack_28;
  undefined4 local_24;
  float local_20;
  Float local_1c;
  Interval local_10;
  undefined1 auVar9 [64];
  
  local_10 = (Interval)vmovlpd_avx(in_ZMM0._0_16_);
  this_01 = (Interaction *)&stack0xfffffffffffffff0;
  this_00 = in_RDI;
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)this_01,0);
  local_1c = Lerp(*pfVar2,in_RSI->zMin,in_RSI->zMax);
  pfVar2 = Tuple2<pbrt::Point2,_float>::operator[]((Tuple2<pbrt::Point2,_float> *)this_01,1);
  local_20 = *pfVar2 * in_RSI->phiMax;
  s = in_RSI->radius;
  std::cos((double)(ulong)(uint)local_20);
  std::sin((double)(ulong)(uint)local_20);
  Point3<float>::Point3((Point3<float> *)this_00,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0)
  ;
  fVar3 = Sqr<float>(local_2c);
  fVar4 = Sqr<float>(fStack_28);
  dVar6 = std::sqrt((double)(ulong)(uint)(fVar3 + fVar4));
  local_30 = SUB84(dVar6,0);
  local_2c = local_2c * (in_RSI->radius / local_30);
  fStack_28 = fStack_28 * (in_RSI->radius / local_30);
  dVar6 = gamma((double)(ulong)(uint)fStack_28);
  uVar5 = SUB84(dVar6,0);
  uVar16 = 0;
  Vector3<float>::Vector3
            ((Vector3<float> *)this_00,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0);
  local_68 = local_74;
  local_70 = local_7c;
  local_88 = local_74;
  local_90 = local_7c;
  uVar11 = 0;
  t.y = (float)uVar5;
  t.x = fVar3;
  t.z = in_stack_fffffffffffffda8;
  VVar13 = Abs<pbrt::Vector3,float>(t);
  local_a8 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar7 = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12 = (undefined1  [56])0x0;
  fVar3 = VVar13.super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = VVar13.super_Tuple3<pbrt::Vector3,_float>.y;
  fVar15 = (float)uVar11;
  uStack_24c = (undefined4)((ulong)uVar11 >> 0x20);
  auVar1._8_4_ = fVar15;
  auVar1._0_8_ = uVar7;
  auVar1._12_4_ = uStack_24c;
  local_b0 = vmovlpd_avx(auVar1);
  t_00.z = fVar15;
  t_00.x = (float)(int)uVar7;
  t_00.y = (float)(int)((ulong)uVar7 >> 0x20);
  local_a0 = local_b0;
  local_98 = local_a8;
  local_60 = local_b0;
  local_58 = local_a8;
  local_50 = local_b0;
  local_48 = local_a8;
  VVar13 = pbrt::operator*(s,t_00);
  local_128 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar12;
  local_130 = vmovlpd_avx(auVar8._0_16_);
  local_f8 = local_24;
  local_120 = CONCAT44(fStack_28,local_2c);
  local_118 = local_24;
  p.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar16;
  p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffdc8;
  p.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdd0;
  e.super_Tuple3<pbrt::Vector3,_float>.y = fVar4;
  e.super_Tuple3<pbrt::Vector3,_float>.x = fVar3;
  e.super_Tuple3<pbrt::Vector3,_float>.z = fVar15;
  local_110 = local_130;
  local_108 = local_128;
  local_100 = local_120;
  local_c0 = local_130;
  local_b8 = local_128;
  local_40 = local_130;
  local_38 = local_128;
  Point3fi::Point3fi((Point3fi *)CONCAT44(s,in_stack_fffffffffffffd90),p,e);
  Transform::operator()((Transform *)this,_phi);
  fVar17 = SUB84(in_RSI->renderFromObject,0);
  Normal3<float>::Normal3
            ((Normal3<float> *)this_00,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),0.0);
  auVar12 = ZEXT856(0);
  n_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffffe94;
  n_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffe90;
  n_01.super_Tuple3<pbrt::Normal3,_float>.z = local_154;
  NVar14 = Transform::operator()(in_stack_fffffffffffffe78,n_01);
  auVar9._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar9._8_56_ = auVar12;
  vmovlpd_avx(auVar9._0_16_);
  auVar12 = ZEXT856(0);
  NVar14.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar16;
  NVar14.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffffdc8;
  NVar14.super_Tuple3<pbrt::Normal3,_float>.z = fVar17;
  NVar14 = Normalize<float>(NVar14);
  local_134 = NVar14.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar10._0_8_ = NVar14.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar10._8_56_ = auVar12;
  local_13c = vmovlpd_avx(auVar10._0_16_);
  if ((in_RSI->reverseOrientation & 1U) != 0) {
    Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_13c,-1);
  }
  Point2<float>::Point2((Point2<float> *)this_00,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0));
  n_00.super_Tuple3<pbrt::Normal3,_float>.y = fVar4;
  n_00.super_Tuple3<pbrt::Normal3,_float>.x = fVar3;
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar15;
  uv_00.super_Tuple2<pbrt::Point2,_float>.y = s;
  uv_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffd90;
  Interaction::Interaction(this_01,(Point3fi *)this_00,n_00,uv_00);
  Area(in_RSI);
  pstd::optional<pbrt::ShapeSample>::optional(this_00,(ShapeSample *)in_RDI);
  return this_00;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        Float z = Lerp(u[0], zMin, zMax);
        Float phi = u[1] * phiMax;
        // Compute cylinder sample position _pi_ and normal _n_ from $z$ and $\phi$
        Point3f pObj = Point3f(radius * std::cos(phi), radius * std::sin(phi), z);
        // Reproject _pObj_ to cylinder surface and compute _pObjError_
        Float hitRad = std::sqrt(Sqr(pObj.x) + Sqr(pObj.y));
        pObj.x *= radius / hitRad;
        pObj.y *= radius / hitRad;
        Vector3f pObjError = gamma(3) * Abs(Vector3f(pObj.x, pObj.y, 0));

        Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, 0)));
        if (reverseOrientation)
            n *= -1;

        Point2f uv(phi / phiMax, (pObj.z - zMin) / (zMax - zMin));
        return ShapeSample{Interaction(pi, n, uv), 1 / Area()};
    }